

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkCollectGroupStats(Cba_Ntk_t *p,Vec_Int_t *vObjs,int *pnFins,int *pnFons)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((long)vObjs->nSize < 1) {
    iVar5 = 0;
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    iVar5 = 0;
    do {
      uVar1 = vObjs->pArray[lVar6];
      if ((int)uVar1 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x158,"int Cba_ObjFinNum(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFin0).nSize <= (int)(uVar1 + 1)) || ((p->vObjFon0).nSize <= (int)(uVar1 + 1))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (p->vObjFin0).pArray;
      piVar3 = (p->vObjFon0).pArray;
      iVar5 = (iVar5 + piVar2[(ulong)uVar1 + 1]) - piVar2[uVar1];
      iVar4 = (iVar4 + piVar3[(ulong)uVar1 + 1]) - piVar3[uVar1];
      lVar6 = lVar6 + 1;
    } while (vObjs->nSize != lVar6);
  }
  *pnFins = iVar5;
  *pnFons = iVar4;
  return;
}

Assistant:

void Cba_NtkCollectGroupStats( Cba_Ntk_t * p, Vec_Int_t * vObjs, int * pnFins, int * pnFons )
{
    int i, iObj, nFins = 0, nFons = 0;
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        nFins += Cba_ObjFinNum(p, iObj);
        nFons += Cba_ObjFonNum(p, iObj);
    }
    *pnFins = nFins;
    *pnFons = nFons;
}